

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorsC.cpp
# Opt level: O3

char * SoapySDR_errToStr(int errorCode)

{
  if (0xfffffff8 < (uint)errorCode) {
    return &DAT_0013abb4 + *(int *)("SOAPY_SDR_ROOT" + (long)errorCode * 4);
  }
  return "UNKNOWN";
}

Assistant:

const char *SoapySDR_errToStr(const int errorCode)
{
    switch(errorCode)
    {
    case SOAPY_SDR_TIMEOUT:         return "TIMEOUT";
    case SOAPY_SDR_STREAM_ERROR:    return "STREAM_ERROR";
    case SOAPY_SDR_CORRUPTION:      return "CORRUPTION";
    case SOAPY_SDR_OVERFLOW:        return "OVERFLOW";
    case SOAPY_SDR_NOT_SUPPORTED:   return "NOT_SUPPORTED";
    case SOAPY_SDR_TIME_ERROR:      return "TIME_ERROR";
    case SOAPY_SDR_UNDERFLOW:       return "UNDERFLOW";
    default: break;
    }
    return "UNKNOWN";
}